

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O2

bool __thiscall
phyr::Sphere::intersectRay(Sphere *this,Ray *ray,double *t0,SurfaceInteraction *si,bool testAlpha)

{
  double dVar1;
  Transform *this_00;
  undefined1 auVar2 [16];
  double dVar3;
  FPError a_00;
  FPError b_00;
  FPError c_00;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  FPError *pFVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 local_6d0 [24];
  undefined1 local_6b8 [16];
  double local_6a8;
  undefined8 uStack_6a0;
  SurfaceInteraction *local_690;
  FPError t2;
  FPError t1;
  Ray lr;
  FPError local_5c8;
  FPError local_5a8;
  FPError c;
  FPError oy;
  FPError ox;
  undefined1 local_548 [16];
  double local_538;
  FPError b;
  FPError a;
  FPError oz;
  Point2f local_4e8;
  Vector3f local_4d8;
  Vector3f local_4b8;
  Normal3f dndv;
  Normal3f dndu;
  undefined1 local_458 [16];
  double local_448;
  Vector3f rdErr;
  Vector3f roErr;
  undefined1 local_400 [24];
  FPError dz;
  FPError dy;
  FPError dx;
  SurfaceInteraction local_3a0;
  SurfaceInteraction local_1e8;
  
  roErr.z = 0.0;
  roErr.x = 0.0;
  roErr.y = 0.0;
  rdErr.x = 0.0;
  rdErr.y = 0.0;
  rdErr.z = 0.0;
  local_690 = si;
  Transform::operator()(&lr,(this->super_Shape).worldToLocal,ray,&roErr,&rdErr);
  FPError::FPError(&ox,lr.o.x,roErr.x);
  FPError::FPError(&oy,lr.o.y,roErr.y);
  FPError::FPError(&oz,lr.o.z,roErr.z);
  FPError::FPError(&dx,lr.d.x,rdErr.x);
  FPError::FPError(&dy,lr.d.y,rdErr.y);
  FPError::FPError(&dz,lr.d.z,rdErr.z);
  FPError::operator*((FPError *)&local_3a0,&dx,&dx);
  FPError::operator*(&b,&dy,&dy);
  FPError::operator+((FPError *)&local_1e8,(FPError *)&local_3a0,&b);
  FPError::operator*(&c,&dz,&dz);
  FPError::operator+(&a,(FPError *)&local_1e8,&c);
  FPError::operator*(&c,&ox,&dx);
  FPError::operator*(&t1,&oy,&dy);
  FPError::operator+((FPError *)&local_3a0,&c,&t1);
  FPError::operator*(&t2,&oz,&dz);
  FPError::operator+((FPError *)&local_1e8,(FPError *)&local_3a0,&t2);
  operator*(&b,2.0,(FPError *)&local_1e8);
  FPError::operator*(&t1,&ox,&ox);
  FPError::operator*(&t2,&oy,&oy);
  FPError::operator+((FPError *)&local_3a0,&t1,&t2);
  FPError::operator*((FPError *)local_6d0,&oz,&oz);
  FPError::operator+((FPError *)&local_1e8,(FPError *)&local_3a0,(FPError *)local_6d0);
  local_5c8.v = this->radius;
  local_548._8_8_ = local_5c8.v;
  local_548._0_8_ = local_5c8.v;
  local_5c8.lBound = local_5c8.v;
  local_5c8.uBound = local_5c8.v;
  local_538 = local_5c8.v;
  FPError::operator*(&local_5a8,&local_5c8,(FPError *)local_548);
  FPError::operator-(&c,(FPError *)&local_1e8,&local_5a8);
  a_00.lBound = a.lBound;
  a_00.v = a.v;
  a_00.uBound = a.uBound;
  b_00.lBound = b.lBound;
  b_00.v = b.v;
  b_00.uBound = b.uBound;
  c_00.lBound = c.lBound;
  c_00.v = c.v;
  c_00.uBound = c.uBound;
  bVar7 = solveQuadraticSystem(a_00,b_00,c_00,&t1,&t2);
  if (bVar7) {
    if (lr.tMax < t1.uBound) {
      return false;
    }
    if (t2.lBound <= 0.0) {
      return false;
    }
    pFVar8 = &t1;
    if ((0.0 < t1.lBound) || (pFVar8 = &t2, t1.uBound = t2.uBound, t2.uBound <= lr.tMax)) {
      dVar13 = pFVar8->v;
      local_6d0._0_8_ = dVar13 * lr.d.x + lr.o.x;
      dVar1 = this->radius;
      dVar14 = dVar13 * lr.d.y + lr.o.y;
      dVar15 = dVar13 * lr.d.z + lr.o.z;
      dVar11 = dVar1 / SQRT(dVar15 * dVar15 +
                            (double)local_6d0._0_8_ * (double)local_6d0._0_8_ + dVar14 * dVar14);
      local_6d0._0_8_ = (double)local_6d0._0_8_ * dVar11;
      dVar14 = dVar11 * dVar14;
      dVar11 = dVar11 * dVar15;
      local_6d0._16_4_ = SUB84(dVar11,0);
      local_6d0._8_8_ = dVar14;
      local_6d0._20_4_ = (int)((ulong)dVar11 >> 0x20);
      dVar15 = this->zMin;
      if (((-dVar1 < dVar15) && (dVar11 < dVar15)) ||
         ((this->zMax < dVar1 && (this->zMax < dVar11)))) {
        if (lr.tMax < t1.uBound) {
          return false;
        }
        if ((dVar13 == t2.v) && (!NAN(dVar13) && !NAN(t2.v))) {
          return false;
        }
        local_6d0._0_8_ = lr.o.x + lr.d.x * t2.v;
        dVar14 = lr.o.y + lr.d.y * t2.v;
        dVar13 = lr.o.z + lr.d.z * t2.v;
        dVar11 = dVar1 / SQRT(dVar13 * dVar13 +
                              (double)local_6d0._0_8_ * (double)local_6d0._0_8_ + dVar14 * dVar14);
        local_6d0._0_8_ = (double)local_6d0._0_8_ * dVar11;
        dVar14 = dVar11 * dVar14;
        dVar11 = dVar11 * dVar13;
        local_6d0._16_4_ = SUB84(dVar11,0);
        local_6d0._8_8_ = dVar14;
        local_6d0._20_4_ = (int)((ulong)dVar11 >> 0x20);
        if ((-dVar1 < dVar15) && (dVar11 < dVar15)) {
          return false;
        }
        dVar13 = t2.v;
        if ((this->zMax < dVar1) && (this->zMax < dVar11)) {
          return false;
        }
      }
      *t0 = dVar13;
      dVar13 = this->thetaMax - this->thetaMin;
      if (((((double)local_6d0._0_8_ == 0.0) && (!NAN((double)local_6d0._0_8_))) && (dVar14 == 0.0))
         && (!NAN(dVar14))) {
        local_6d0._0_8_ = this->radius * 9.999999747378752e-06;
      }
      uVar4 = local_6d0._0_8_;
      local_6b8._8_4_ = SUB84(dVar11,0);
      local_6b8._0_8_ = dVar14;
      local_6b8._12_4_ = (int)((ulong)dVar11 >> 0x20);
      dVar1 = atan2(dVar14,(double)local_6d0._0_8_);
      uVar6 = local_6b8._8_8_;
      dVar11 = (double)local_6b8._8_8_ / this->radius;
      dVar15 = -1.0;
      if (-1.0 <= dVar11) {
        dVar15 = dVar11;
      }
      uVar9 = 0;
      uVar10 = 0x3ff00000;
      local_6a8 = 1.0;
      uStack_6a0 = 0;
      if (dVar15 <= 1.0) {
        uVar9 = SUB84(dVar15,0);
        uVar10 = (undefined4)((ulong)dVar15 >> 0x20);
      }
      dVar14 = acos((double)CONCAT44(uVar10,uVar9));
      dVar15 = this->thetaMin;
      local_5a8.v = (double)local_6b8._0_8_ * -6.283185307179586;
      local_5a8.lBound = (double)uVar4 * 6.283185307179586;
      local_5a8.uBound = 0.0;
      local_6a8 = local_6a8 /
                  SQRT((double)uVar4 * (double)uVar4 +
                       (double)local_6b8._0_8_ * (double)local_6b8._0_8_);
      dVar11 = this->radius;
      dVar3 = sin(dVar14);
      local_5c8.uBound = dVar3 * -dVar11 * dVar13;
      uVar5 = local_6b8._0_8_;
      local_5c8.v = dVar13 * local_6a8 * (double)uVar4 * (double)uVar6;
      local_5c8.lBound = dVar13 * local_6a8 * (double)local_6b8._0_8_ * (double)uVar6;
      local_548._8_4_ = SUB84((double)local_6b8._0_8_ * -39.47841760435743,0);
      local_548._0_8_ = (double)uVar4 * -39.47841760435743;
      local_548._12_4_ = (int)((ulong)((double)local_6b8._0_8_ * -39.47841760435743) >> 0x20);
      local_538 = -0.0;
      dVar11 = dVar13 * (double)uVar6 * 6.283185307179586;
      local_400._0_8_ = -(local_6a8 * (double)local_6b8._0_8_) * dVar11;
      local_400._16_4_ = SUB84(dVar11 * 0.0,0);
      local_400._8_8_ = dVar11 * local_6a8 * (double)uVar4;
      local_400._20_4_ = (int)((ulong)(dVar11 * 0.0) >> 0x20);
      dVar11 = -dVar13 * dVar13;
      local_448 = dVar11 * (double)uVar6;
      local_458._8_4_ = SUB84(dVar11 * (double)local_6b8._0_8_,0);
      local_458._0_8_ = dVar11 * (double)uVar4;
      local_458._12_4_ = (int)((ulong)(dVar11 * (double)local_6b8._0_8_) >> 0x20);
      dndu.x = 0.0;
      dndu.y = 0.0;
      dndu.z = 0.0;
      dndv.x = 0.0;
      dndv.y = 0.0;
      dndv.z = 0.0;
      solveSurfaceNormal((Vector3f *)&local_5a8,(Vector3f *)&local_5c8,(Vector3f *)local_548,
                         (Vector3f *)local_400,(Vector3f *)local_458,&dndu,&dndv);
      local_4b8.z = ABS((double)uVar6) * 5.551115123125786e-16;
      local_4b8.x = ABS((double)uVar4) * 5.551115123125786e-16;
      local_4b8.y = ABS((double)uVar5) * 5.551115123125786e-16;
      this_00 = (this->super_Shape).localToWorld;
      local_4d8.z = -lr.d.z;
      local_4d8.x = -lr.d.x;
      local_4d8.y = -lr.d.y;
      auVar12._8_8_ = dVar14 - dVar15;
      auVar12._0_8_ =
           ~-(ulong)(dVar1 < 0.0) & (ulong)dVar1 |
           (ulong)(dVar1 + 6.283185307179586) & -(ulong)(dVar1 < 0.0);
      auVar2._8_4_ = SUB84(dVar13,0);
      auVar2._0_8_ = 0x401921fb54442d18;
      auVar2._12_4_ = (int)((ulong)dVar13 >> 0x20);
      local_4e8 = (Point2f)divpd(auVar12,auVar2);
      SurfaceInteraction::SurfaceInteraction
                (&local_3a0,(Point3f *)local_6d0,&local_4d8,&local_4b8,&local_4e8,
                 (Vector3f *)&local_5a8,(Vector3f *)&local_5c8,&dndu,&dndv,&this->super_Shape);
      Transform::operator()(&local_1e8,this_00,&local_3a0);
      memcpy(local_690,&local_1e8,0x1b8);
      return true;
    }
  }
  return false;
}

Assistant:

bool Sphere::intersectRay(const Ray& ray, Real* t0, SurfaceInteraction* si,
                          bool testAlpha) const {
    Vector3f roErr, rdErr;
    // Transform ray to local space
    Ray lr = (*worldToLocal)(ray, &roErr, &rdErr);

    // Compute quadratic sphere coefficients
    FPError ox(lr.o.x, roErr.x), oy(lr.o.y, roErr.y), oz(lr.o.z, roErr.z);
    FPError dx(lr.d.x, rdErr.x), dy(lr.d.y, rdErr.y), dz(lr.d.z, rdErr.z);
    FPError a = dx * dx + dy * dy + dz * dz;
    FPError b = 2 * (ox * dx + oy * dy + oz * dz);
    FPError c = ox * ox + oy * oy + oz * oz - FPError(radius) * FPError(radius);

    // Solve quadratic equation for t
    FPError t1, t2;
    // No intersections
    if (!solveQuadraticSystem(a, b, c, &t1, &t2)) return false;

    // Check for trivial range exclusion
    if (t1.upperBound() > lr.tMax || t2.lowerBound() <= 0) return false;
    FPError tt0 = t1;
    if (tt0.lowerBound() <= 0) {
        tt0 = t2; if (tt0.upperBound() > lr.tMax) return false;
    }

    Point3f hpt = lr(Real(tt0));
    // Reproject the point onto the surface to refine it
    hpt *= radius / distance(hpt, Point3f(0, 0, 0));

    if ((zMin > -radius && hpt.z < zMin) || (zMax < radius && hpt.z > zMax)) {
        // If ray origin is inside the sphere and t2 intersects a clipped region
        if (tt0 == t2) return false;
        // We're looking at a hole in the sphere on the near side.
        // Test intersection with the farther side
        if (tt0.upperBound() > lr.tMax) return false;

        // Test with t1 failed, try t2
        tt0 = t2; hpt = lr(Real(tt0));
        // Reproject the point onto the surface to refine it
        hpt *= radius / distance(hpt, Point3f(0, 0, 0));

        if ((zMin > -radius && hpt.z < zMin) || (zMax < radius && hpt.z > zMax))
            return false;
    }

    *t0 = Real(tt0);
    Real twoPi = 2 * Pi, delTheta = thetaMax - thetaMin;

    // Make sure phi = atan(y / x) doesn't result in NaN
    if (hpt.x == 0 && hpt.y == 0) hpt.x = 1e-5f * radius;
    // Compute phi and theta values
    Real phi = std::atan2(hpt.y, hpt.x);
    // Cover the full range [0, 2*Pi] in a continuous cycle
    if (phi < 0) phi += twoPi;
    Real theta = std::acos(clamp(hpt.z / radius, -1, 1));

    // Compute (u, v) parameters from phi and theta
    Real u = phi / twoPi;
    Real v = (theta - thetaMin) / delTheta;

    // Compute partial derivatives for the sphere
    Real hypot = std::sqrt(hpt.x * hpt.x + hpt.y * hpt.y);
    Real invHypot = 1 / hypot;
    Real cosPhi = hpt.x * invHypot, sinPhi = hpt.y * invHypot;

    Vector3f dpdu = Vector3f(-twoPi * hpt.y, twoPi * hpt.x, 0);
    Vector3f dpdv = delTheta * Vector3f(hpt.z * cosPhi, hpt.z * sinPhi, -radius * std::sin(theta));

    // Compute second derivatives
    Vector3f d2pduu = -twoPi * twoPi * Vector3f(hpt.x, hpt.y, 0);
    Vector3f d2pduv = delTheta * hpt.z * twoPi * Vector3f(-sinPhi, cosPhi, 0);
    Vector3f d2pdvv = -delTheta * delTheta * Vector3f(hpt.x, hpt.y, hpt.z);

    // Compute surface normals
    Normal3f dndu, dndv;
    solveSurfaceNormal(dpdu, dpdv, d2pduu,d2pduv, d2pdvv, &dndu, &dndv);

    // Compute error bounds for ray-sphere intersection
    Vector3f pfError = abs(Vector3f(hpt)) * gamma(5);
    // Initiate the SurfaceInteraction object
    *si = (*localToWorld)(SurfaceInteraction(hpt, -lr.d, pfError,
                                             Point2f(u, v), dpdu, dpdv, dndu, dndv, this));

    return true;
}